

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Serialization_Test<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Serialization_Test<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  pair<int,_int> key;
  reference this_00;
  key_type expected_predicate_value;
  size_type sVar4;
  key_type kVar5;
  reference file;
  key_type this_01;
  bool *success;
  int iVar6;
  long in_RDI;
  value_type vVar7;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  TypeParam ht_in;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  FILE *fp;
  int i;
  TypeParam ht_out;
  key_type *in_stack_fffffffffffff8d8;
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff8e0;
  pair<const_std::pair<int,_int>,_int> *in_stack_fffffffffffff8e8;
  hasher *in_stack_fffffffffffff8f0;
  int iVar8;
  HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff8f8;
  HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff900;
  undefined8 in_stack_fffffffffffff908;
  Type TVar9;
  undefined4 in_stack_fffffffffffff910;
  undefined4 in_stack_fffffffffffff914;
  char *in_stack_fffffffffffff940;
  undefined4 in_stack_fffffffffffff948;
  undefined4 in_stack_fffffffffffff94c;
  char *in_stack_fffffffffffff950;
  AssertionResult *in_stack_fffffffffffff958;
  AssertHelper *in_stack_fffffffffffff960;
  undefined6 in_stack_fffffffffffff980;
  string local_618 [48];
  undefined4 in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa1c;
  undefined4 in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffa24;
  AssertionResult local_5d8;
  string local_5c8 [52];
  key_type local_594;
  undefined1 local_589;
  AssertionResult local_588 [2];
  key_type local_568;
  value_type local_510;
  value_type local_500;
  AssertionResult local_4f0;
  string local_4e0 [52];
  key_type local_4ac;
  undefined1 local_4a1;
  AssertionResult local_4a0 [2];
  key_type local_480;
  value_type local_428;
  value_type local_418;
  AssertionResult local_408 [2];
  key_type local_3e8;
  pair<int,_int> local_390;
  int local_388;
  pair<int,_int> local_380;
  int local_378;
  AssertionResult local_370;
  string local_360 [55];
  undefined1 local_329;
  AssertionResult local_328;
  string local_318 [55];
  undefined1 local_2e1;
  AssertionResult local_2e0;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_2d0 [2];
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_2a8;
  string local_208 [55];
  undefined1 local_1d1;
  AssertionResult local_1d0;
  string local_1c0 [55];
  undefined1 local_189;
  AssertionResult local_188;
  FILE *local_178;
  key_type local_170;
  key_type local_168;
  value_type local_108;
  value_type local_f8;
  int local_e8;
  key_type local_e4;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_d0 [2];
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_a8;
  
  bVar1 = google::
          HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_serialization
                    ((HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)(in_RDI + 0x10));
  if (bVar1) {
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff8e0,
               (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20));
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff8e0,
               (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20));
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_d0,0,(int *)0x0);
    google::
    HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashMap
              ((HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)in_stack_fffffffffffff900,(size_type)in_stack_fffffffffffff8f8,
               in_stack_fffffffffffff8f0,(key_equal *)in_stack_fffffffffffff8e8,
               (allocator_type *)in_stack_fffffffffffff8e0);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_d0);
    local_e4 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffff8f8,(int)((ulong)in_stack_fffffffffffff8f0 >> 0x20)
                          );
    google::
    BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key(in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
    for (local_e8 = 1; TVar9 = (Type)((ulong)in_stack_fffffffffffff908 >> 0x20), local_e8 < 100;
        local_e8 = local_e8 + 1) {
      vVar7 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff900,
                             (int)((ulong)in_stack_fffffffffffff8f8 >> 0x20));
      local_108 = vVar7;
      local_f8 = vVar7;
      google::
      BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert((BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
               (value_type *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
    }
    local_168 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff8f8,
                            (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
    local_170 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff8f8,
                            (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
    local_178 = tmpfile();
    local_189 = local_178 != (FILE *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff8e0,(bool *)in_stack_fffffffffffff8d8,
               (type *)0xf4ffc1);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_188);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                 (char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                 in_stack_fffffffffffff940);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),TVar9
                 ,(char *)in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
                 (char *)in_stack_fffffffffffff8f0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffff960,(Message *)in_stack_fffffffffffff958);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
      std::__cxx11::string::~string(local_1c0);
      testing::Message::~Message((Message *)0xf50084);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf50118);
    uVar2 = google::
            BaseHashtableInterface<google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::serialize<ValueSerializer,_IO_FILE>(&local_a8,local_178);
    local_1d1 = uVar2;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff8e0,(bool *)in_stack_fffffffffffff8d8,
               (type *)0xf5015f);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d0);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                 (char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                 in_stack_fffffffffffff940);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),TVar9
                 ,(char *)in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
                 (char *)in_stack_fffffffffffff8f0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffff960,(Message *)in_stack_fffffffffffff958);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
      std::__cxx11::string::~string(local_208);
      testing::Message::~Message((Message *)0xf50234);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf502cb);
    rewind(local_178);
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff8e0,
               (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20));
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff8e0,
               (int)((ulong)in_stack_fffffffffffff8d8 >> 0x20));
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_2d0,0,(int *)0x0);
    google::
    HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashMap
              ((HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)in_stack_fffffffffffff900,(size_type)in_stack_fffffffffffff8f8,
               in_stack_fffffffffffff8f0,(key_equal *)in_stack_fffffffffffff8e8,
               (allocator_type *)in_stack_fffffffffffff8e0);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_2d0);
    local_2e1 = local_178 != (FILE *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff8e0,(bool *)in_stack_fffffffffffff8d8,
               (type *)0xf50373);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2e0);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                 (char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                 in_stack_fffffffffffff940);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),TVar9
                 ,(char *)in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
                 (char *)in_stack_fffffffffffff8f0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffff960,(Message *)in_stack_fffffffffffff958);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
      std::__cxx11::string::~string(local_318);
      testing::Message::~Message((Message *)0xf50487);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf5051b);
    uVar3 = google::
            BaseHashtableInterface<google::sparse_hash_map<std::pair<int,int>,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::unserialize<ValueSerializer,_IO_FILE>(&local_2a8,local_178);
    local_329 = uVar3;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff8e0,(bool *)in_stack_fffffffffffff8d8,
               (type *)0xf50562);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_328);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                 (char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                 in_stack_fffffffffffff940);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),TVar9
                 ,(char *)in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
                 (char *)in_stack_fffffffffffff8f0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffff960,(Message *)in_stack_fffffffffffff958);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
      std::__cxx11::string::~string(local_360);
      testing::Message::~Message((Message *)0xf50637);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf506ce);
    fclose(local_178);
    vVar7 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueObject(in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20)
                          );
    local_388 = vVar7.second;
    key = vVar7.first;
    local_390 = key;
    local_380 = key;
    local_378 = local_388;
    local_3e8 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff8f8,
                            (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find((BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff980)),(key_type *)key);
    this_00 = google::
              sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator*((sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                           *)0xf50794);
    testing::internal::EqHelper::
    Compare<std::pair<const_std::pair<int,_int>,_int>,_std::pair<const_std::pair<int,_int>,_int>,_nullptr>
              ((char *)in_stack_fffffffffffff8f8,(char *)in_stack_fffffffffffff8f0,
               in_stack_fffffffffffff8e8,
               (pair<const_std::pair<int,_int>,_int> *)in_stack_fffffffffffff8e0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_370);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
      in_stack_fffffffffffff958 =
           (AssertionResult *)testing::AssertionResult::failure_message((AssertionResult *)0xf50811)
      ;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),TVar9
                 ,(char *)in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
                 (char *)in_stack_fffffffffffff8f0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)in_stack_fffffffffffff958);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
      testing::Message::~Message((Message *)0xf50874);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf508e5);
    vVar7 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueObject(in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20)
                          );
    local_428 = vVar7;
    local_418 = vVar7;
    expected_predicate_value =
         HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueKey(in_stack_fffffffffffff8f8,(int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
    local_480 = expected_predicate_value;
    google::
    BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find((BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff980)),(key_type *)key);
    google::
    sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)0xf5098a);
    testing::internal::EqHelper::
    Compare<std::pair<const_std::pair<int,_int>,_int>,_std::pair<const_std::pair<int,_int>,_int>,_nullptr>
              ((char *)in_stack_fffffffffffff8f8,(char *)in_stack_fffffffffffff8f0,
               in_stack_fffffffffffff8e8,
               (pair<const_std::pair<int,_int>,_int> *)in_stack_fffffffffffff8e0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_408);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
      testing::AssertionResult::failure_message((AssertionResult *)0xf50a01);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),TVar9
                 ,(char *)in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
                 (char *)in_stack_fffffffffffff8f0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)in_stack_fffffffffffff958);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
      testing::Message::~Message((Message *)0xf50a5e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf50acf);
    local_4ac = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff8f8,
                            (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
    sVar4 = google::
            BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::count(in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
    local_4a1 = sVar4 == 0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff8e0,(bool *)in_stack_fffffffffffff8d8,
               (type *)0xf50b3a);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4a0);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffff958,(char *)vVar7.first,
                 (char *)CONCAT44(vVar7.second,in_stack_fffffffffffff948),
                 (char *)expected_predicate_value);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),TVar9
                 ,(char *)in_stack_fffffffffffff900,(int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
                 (char *)in_stack_fffffffffffff8f0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)in_stack_fffffffffffff958);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
      std::__cxx11::string::~string(local_4e0);
      testing::Message::~Message((Message *)0xf50c0f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf50ca6);
    local_510 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffff900,
                               (int)((ulong)in_stack_fffffffffffff8f8 >> 0x20));
    iVar6 = local_510.second;
    local_500 = local_510;
    kVar5 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff8f8,(int)((ulong)in_stack_fffffffffffff8f0 >> 0x20));
    local_568 = kVar5;
    google::
    BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find((BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff980)),(key_type *)key);
    TVar9 = kVar5.second;
    file = google::
           sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::operator*((sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)0xf50d4b);
    testing::internal::EqHelper::
    Compare<std::pair<const_std::pair<int,_int>,_int>,_std::pair<const_std::pair<int,_int>,_int>,_nullptr>
              ((char *)in_stack_fffffffffffff8f8,(char *)in_stack_fffffffffffff8f0,
               in_stack_fffffffffffff8e8,
               (pair<const_std::pair<int,_int>,_int> *)in_stack_fffffffffffff8e0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4f0);
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT44(iVar6,in_stack_fffffffffffff910));
      in_stack_fffffffffffff8f8 =
           (HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0xf50dc2);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(iVar6,in_stack_fffffffffffff910),TVar9,(char *)file,
                 (int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),(char *)in_stack_fffffffffffff8f0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)in_stack_fffffffffffff958);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
      testing::Message::~Message((Message *)0xf50e1f);
    }
    iVar8 = (int)((ulong)in_stack_fffffffffffff8f0 >> 0x20);
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf50e90);
    kVar5 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff8f8,iVar8);
    local_594 = kVar5;
    sVar4 = google::
            BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::count(in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
    local_589 = sVar4 == 0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff8e0,(bool *)in_stack_fffffffffffff8d8,
               (type *)0xf50efb);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_588);
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT44(iVar6,in_stack_fffffffffffff910));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffff958,(char *)vVar7.first,
                 (char *)CONCAT44(vVar7.second,in_stack_fffffffffffff948),
                 (char *)expected_predicate_value);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(iVar6,in_stack_fffffffffffff910),TVar9,(char *)file,
                 (int)((ulong)in_stack_fffffffffffff8f8 >> 0x20),(char *)kVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)in_stack_fffffffffffff958);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff8e0);
      std::__cxx11::string::~string(local_5c8);
      testing::Message::~Message((Message *)0xf50fd0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf51067);
    this_01 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff8f8,kVar5.second);
    iVar8 = (int)((ulong)in_stack_fffffffffffff8f8 >> 0x20);
    success = (bool *)google::
                      BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::count((BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)this_01,in_stack_fffffffffffff8d8);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)this_01,success,(type *)0xf510d0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5d8);
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT44(iVar6,in_stack_fffffffffffff910));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffff958,(char *)vVar7.first,
                 (char *)CONCAT44(vVar7.second,in_stack_fffffffffffff948),
                 (char *)expected_predicate_value);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(iVar6,in_stack_fffffffffffff910),TVar9,(char *)file,iVar8,
                 (char *)kVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)in_stack_fffffffffffff958);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
      std::__cxx11::string::~string(local_618);
      testing::Message::~Message((Message *)0xf511a5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf51239);
    google::
    HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashMap
              ((HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf51246);
    google::
    HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashMap
              ((HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf51253);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Serialization) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  auto fp = tmpfile();
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_out.serialize(ValueSerializer(), fp));
  rewind(fp);

  TypeParam ht_in;
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_in.unserialize(ValueSerializer(), fp));
  fclose(fp);

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}